

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDevice.cpp
# Opt level: O0

bool __thiscall BlockDevice::ReadMakeModelRevisionSerial(BlockDevice *this,string *path)

{
  int iVar1;
  string local_240;
  allocator local_219;
  string local_218 [32];
  string local_1f8;
  allocator local_1d1;
  string local_1d0 [32];
  string local_1b0;
  allocator local_189;
  undefined1 local_188 [8];
  string s_1;
  uint8_t buf [96];
  allocator local_e1;
  string local_e0 [32];
  string local_c0;
  allocator local_99;
  string local_98 [32];
  string local_78;
  allocator local_41;
  undefined1 local_40 [8];
  string s;
  string *path_local;
  BlockDevice *this_local;
  
  s.field_2._8_8_ = path;
  iVar1 = ioctl((this->super_HDD).h,0x30d,&ReadMakeModelRevisionSerial::hd);
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_40,(char *)ReadMakeModelRevisionSerial::hd.model,0x28,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    util::trim(&local_78,(string *)local_40);
    std::__cxx11::string::operator=((string *)&(this->super_HDD).strMakeModel,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,(char *)ReadMakeModelRevisionSerial::hd.serial_no,0x14,&local_99);
    std::__cxx11::string::operator=((string *)local_40,local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    util::trim(&local_c0,(string *)local_40);
    std::__cxx11::string::operator=
              ((string *)&(this->super_HDD).strSerialNumber,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,(char *)ReadMakeModelRevisionSerial::hd.fw_rev,8,&local_e1);
    std::__cxx11::string::operator=((string *)local_40,local_e0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    util::trim((string *)(buf + 0x58),(string *)local_40);
    std::__cxx11::string::operator=
              ((string *)&(this->super_HDD).strFirmwareRevision,(string *)(buf + 0x58));
    std::__cxx11::string::~string((string *)(buf + 0x58));
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    iVar1 = ScsiCmd(this,(this->super_HDD).h,"\x12",6,(void *)((long)&s_1.field_2 + 8),0x60,true);
    if (iVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_188,(char *)(buf + 8),0x10,&local_189);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      util::trim(&local_1b0,(string *)local_188);
      std::__cxx11::string::operator=
                ((string *)&(this->super_HDD).strMakeModel,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,(char *)(buf + 0x18),4,&local_1d1);
      std::__cxx11::string::operator=((string *)local_188,local_1d0);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      util::trim(&local_1f8,(string *)local_188);
      std::__cxx11::string::operator=
                ((string *)&(this->super_HDD).strFirmwareRevision,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      iVar1 = ScsiCmd(this,(this->super_HDD).h,ReadMakeModelRevisionSerial::cmdSerial,6,
                      (void *)((long)&s_1.field_2 + 8),0x60,true);
      if ((iVar1 == 0) && (s_1.field_2._M_local_buf[9] == -0x80)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_218,s_1.field_2._M_local_buf + 0xc,
                   (ulong)(byte)s_1.field_2._M_local_buf[0xb],&local_219);
        std::__cxx11::string::operator=((string *)local_188,local_218);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
        util::trim(&local_240,(string *)local_188);
        std::__cxx11::string::operator=
                  ((string *)&(this->super_HDD).strSerialNumber,(string *)&local_240);
        std::__cxx11::string::~string((string *)&local_240);
      }
      this_local._7_1_ = true;
      std::__cxx11::string::~string((string *)local_188);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BlockDevice::ReadMakeModelRevisionSerial(const std::string& path)
{
#ifdef _WIN32
    (void)path; // unused
    MEMORY mem(512);
    PSTORAGE_DEVICE_DESCRIPTOR pDevDesc = reinterpret_cast<PSTORAGE_DEVICE_DESCRIPTOR>(mem.pb);
    pDevDesc->Size = static_cast<DWORD>(mem.size);

    STORAGE_PROPERTY_QUERY spq;
    spq.QueryType = PropertyStandardQuery;
    spq.PropertyId = StorageDeviceProperty;

    DWORD dwRet;
    HANDLE hdevice = reinterpret_cast<HANDLE>(_get_osfhandle(this->h));
    if (DeviceIoControl(hdevice, IOCTL_STORAGE_QUERY_PROPERTY, &spq, sizeof(spq), pDevDesc, pDevDesc->Size, &dwRet, nullptr) && pDevDesc->ProductIdOffset)
    {
        // We've read something, so clear existing values
        strMakeModel = strFirmwareRevision = strSerialNumber = "";

        if (pDevDesc->VendorIdOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->VendorIdOffset);
            strMakeModel = util::trim(s);
        }

        if (pDevDesc->ProductIdOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->ProductIdOffset);
            strMakeModel += util::trim(s);
        }

        if (pDevDesc->ProductRevisionOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->ProductRevisionOffset);
            strFirmwareRevision = util::trim(s);
        }

        if (pDevDesc->SerialNumberOffset)
        {
            std::string s(reinterpret_cast<char*>(pDevDesc) + pDevDesc->SerialNumberOffset);
            strSerialNumber = util::trim(s);
        }

        return true;
    }
#endif // WIN32

#ifdef HAVE_LINUX_HDREG_H
    (void)path; // unused
    static struct hd_driveid hd;

    // ATA query
    if (!ioctl(h, HDIO_GET_IDENTITY, &hd))
    {
        std::string s = std::string(reinterpret_cast<const char*>(hd.model), 40);
        strMakeModel = util::trim(s);

        s = std::string(reinterpret_cast<const char*>(hd.serial_no), 20);
        strSerialNumber = util::trim(s);

        s = std::string(reinterpret_cast<const char*>(hd.fw_rev), 8);
        strFirmwareRevision = util::trim(s);

        return true;
    }
#endif // HDIO_GET_IDENTITY

#if defined(HAVE_SCSI_SCSI_H) && defined(HAVE_SCSI_SG_H)
    // SCSI query
    {
        uint8_t buf[96];

        static const uint8_t cmdInquiry[] = {
            INQUIRY, 0, 0, 0, sizeof(buf), 0
        };
        static const uint8_t cmdSerial[] = {
            INQUIRY, 0x01, 0x80, 0, sizeof(buf), 0
        };

        // Read the device details
        if (ScsiCmd(h, cmdInquiry, sizeof(cmdInquiry), buf, sizeof(buf), true) == 0)
        {
            /*
                        // Vendor identification (8-15)
                        std::string s = std::string(reinterpret_cast<char*>(buf+8), 8);
                        strMakeModel = util::trim(s);
            */
            // Product identification (16-31)
            auto s = std::string(reinterpret_cast<char*>(buf + 16), 16);
            strMakeModel = util::trim(s);

            // Product revision level (32-35)
            s = std::string(reinterpret_cast<char*>(buf + 32), 4);
            strFirmwareRevision = util::trim(s);

            // Read the device serial number
            if (ScsiCmd(h, cmdSerial, sizeof(cmdSerial), buf, sizeof(buf), true) == 0)
            {
                if (buf[1] == 0x80) // Page 80h = Unit serial number
                {
                    s = std::string(reinterpret_cast<char*>(buf + 4), buf[3]);
                    strSerialNumber = util::trim(s);
                }
            }

            return true;
        }
    }
#endif

#if defined(HAVE_DISKARBITRATION_DISKARBITRATION_H)
    DASessionRef session = DASessionCreate(kCFAllocatorDefault);
    DADiskRef disk = DADiskCreateFromBSDName(kCFAllocatorDefault, session, path.c_str());
    if (disk)
    {
        CFDictionaryRef diskInfo = DADiskCopyDescription(disk);
        if (diskInfo)
        {
            // Clear existing values
            strMakeModel = strFirmwareRevision = strSerialNumber = "";

            auto strVendor = static_cast<CFStringRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionDeviceVendorKey));
            auto strModel = static_cast<CFStringRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionDeviceModelKey));
            auto strRevision = static_cast<CFStringRef>(CFDictionaryGetValue(diskInfo, kDADiskDescriptionDeviceRevisionKey));

            if (strVendor)
            {
                std::string s = CFStringGetCStringPtr(strVendor, 0);
                strMakeModel = util::trim(s);
            }

            if (strModel)
            {
                std::string s = CFStringGetCStringPtr(strModel, 0);
                strMakeModel += util::trim(s);
            }

            if (strRevision)
            {
                std::string s = CFStringGetCStringPtr(strRevision, 0);
                strFirmwareRevision = util::trim(s);
            }

            CFRelease(diskInfo);
        }

        CFRelease(disk);
        CFRelease(session);
    }
#endif // HAVE_DISKARBITRATION_DISKARBITRATION_H

    return false;
}